

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

mpc_val_t * mpcf_escape_new(mpc_val_t *x,char *input,char **output)

{
  size_t sVar1;
  size_t sVar2;
  long in_RDX;
  long in_RSI;
  char *in_RDI;
  char *y;
  char *s;
  char buff [2];
  int found;
  int i;
  char *local_38;
  char *local_30;
  char local_22 [2];
  int local_20;
  int local_1c;
  long local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_38 = (char *)calloc(1,1);
  local_30 = in_RDI;
  do {
    if (*local_30 == '\0') {
      return local_38;
    }
    local_1c = 0;
    local_20 = 0;
    while (*(long *)(local_18 + (long)local_1c * 8) != 0) {
      if (*local_30 == *(char *)(local_10 + local_1c)) {
        sVar1 = strlen(local_38);
        sVar2 = strlen(*(char **)(local_18 + (long)local_1c * 8));
        local_38 = (char *)realloc(local_38,sVar1 + sVar2 + 1);
        strcat(local_38,*(char **)(local_18 + (long)local_1c * 8));
        local_20 = 1;
        break;
      }
      local_1c = local_1c + 1;
    }
    if (local_20 == 0) {
      sVar1 = strlen(local_38);
      local_38 = (char *)realloc(local_38,sVar1 + 2);
      local_22[0] = *local_30;
      local_22[1] = 0;
      strcat(local_38,local_22);
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

static mpc_val_t *mpcf_escape_new(mpc_val_t *x, const char *input, const char **output) {

  int i;
  int found;
  char buff[2];
  char *s = x;
  char *y = calloc(1, 1);

  while (*s) {

    i = 0;
    found = 0;

    while (output[i]) {
      if (*s == input[i]) {
        y = realloc(y, strlen(y) + strlen(output[i]) + 1);
        strcat(y, output[i]);
        found = 1;
        break;
      }
      i++;
    }

    if (!found) {
      y = realloc(y, strlen(y) + 2);
      buff[0] = *s; buff[1] = '\0';
      strcat(y, buff);
    }

    s++;
  }


  return y;
}